

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

double house_1(double *x,int N,double *v)

{
  double *C;
  double dVar1;
  int local_44;
  int i;
  double *sigma;
  double temp;
  double mu;
  double beta;
  double *v_local;
  int N_local;
  double *x_local;
  
  C = (double *)malloc(8);
  if (N < 2) {
    *C = 0.0;
  }
  else {
    mmult(x + 1,x + 1,C,1,N + -1,1);
  }
  *v = 1.0;
  for (local_44 = 1; local_44 < N; local_44 = local_44 + 1) {
    v[local_44] = x[local_44];
  }
  if (((*C != 0.0) || (NAN(*C))) || (*x < 0.0)) {
    if (((*C != 0.0) || (NAN(*C))) || (0.0 < *x || *x == 0.0)) {
      dVar1 = sqrt(*x * *x + *C);
      if (0.0 < *x) {
        *v = -*C / (*x + dVar1);
      }
      else {
        *v = *x - dVar1;
      }
      dVar1 = *v;
      mu = (*v * 2.0 * *v) / (*v * *v + *C);
      for (local_44 = 0; local_44 < N; local_44 = local_44 + 1) {
        v[local_44] = v[local_44] / dVar1;
      }
    }
    else {
      mu = -2.0;
    }
  }
  else {
    mu = 0.0;
  }
  free(C);
  return mu;
}

Assistant:

static double house_1(double*x,int N,double *v) {
	double beta,mu,temp;
	double *sigma;
	int i;
	
	sigma = (double*) malloc(sizeof(double) * 1);
	
	if (N > 1) {
		mmult(x+1,x+1,sigma,1,N-1,1);
	} else {
		sigma[0] = 0.0;
	}
	
	v[0] =1.;
	for (i = 1; i < N;++i) {
		v[i] = x[i];
	}
	
	if (sigma[0] == 0. && x[0] >= 0.) {
		beta = 0.;
	} else if (sigma[0] == 0. && x[0] < 0.) {
		beta = -2.;
	}else {
		mu = sqrt(sigma[0] + x[0] * x[0]);
		
		if (x[0] <= 0.) {
			v[0] = x[0] - mu;
		} else {
			v[0] = - sigma[0] / (x[0] + mu);
		}
		temp = v[0];
		
		beta = (2.0 * v[0] * v[0]) /(sigma[0] + v[0] * v[0]);
		
		for (i = 0; i < N;++i) {
			v[i] /= temp;
		}
		
	}
	
	free(sigma);
	return beta;
}